

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_347e::ProfileDataTest_StartWhenStarted_Test::
ProfileDataTest_StartWhenStarted_Test(ProfileDataTest_StartWhenStarted_Test *this)

{
  ProfileDataTest_StartWhenStarted_Test *this_local;
  
  ProfileDataTest::ProfileDataTest(&this->super_ProfileDataTest);
  (this->super_ProfileDataTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ProfileDataTest_StartWhenStarted_Test_00197840;
  return;
}

Assistant:

TEST_F(ProfileDataTest, StartWhenStarted) {
  const int frequency = 1;
  ProfileDataSlot slots[] = {
    0, 3, 0, 1000000 / frequency, 0,    // binary header
    0, 1, 0                             // binary trailer
  };

  ProfileData::Options options;
  options.set_frequency(frequency);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));

  ProfileData::State state_before;
  collector_.GetCurrentState(&state_before);

  options.set_frequency(frequency * 2);
  CHECK(!collector_.Start("foobar", options));

  ProfileData::State state_after;
  collector_.GetCurrentState(&state_after);
  ExpectSameState(state_before, state_after);

  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.Check(slots, arraysize(slots)));
}